

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::ResponsesCache::Put(ResponsesCache *this,Response *aResponse)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  Response *local_18;
  Response *aResponse_local;
  ResponsesCache *this_local;
  
  local_18 = aResponse;
  aResponse_local = (Response *)this;
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20 = std::chrono::operator+(&local_28,&this->mLifetime);
  std::
  multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,ot::commissioner::coap::Message,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>>
  ::
  emplace<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,ot::commissioner::coap::Message_const&>
            ((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,ot::commissioner::coap::Message,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>>
              *)&this->mContainer,&local_20,local_18);
  return;
}

Assistant:

void Put(const Response &aResponse) { mContainer.emplace(Clock::now() + mLifetime, aResponse); }